

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O3

void DeleteClippingPlaneData(ON_ClippingPlaneDataStore *dataStore)

{
  uint sn;
  bool bVar1;
  
  sn = dataStore->m_sn;
  if (sn != 0) {
    bVar1 = ON_SleepLock::GetLock(&g_data_list_lock);
    dataStore->m_sn = 0;
    ON_ClippingPlaneDataList::DeleteEntry(&g_data_list,sn);
    if (bVar1) {
      ON_SleepLock::ReturnLock(&g_data_list_lock);
      return;
    }
  }
  return;
}

Assistant:

static void DeleteClippingPlaneData(ON_ClippingPlaneDataStore& dataStore)
{
  const unsigned int serial_number = dataStore.m_sn;
  if (serial_number>0)
  {
    bool bReturnLock = g_data_list_lock.GetLock();
    dataStore.m_sn = 0;
    g_data_list.DeleteEntry(serial_number);
    if(bReturnLock)
      g_data_list_lock.ReturnLock();
  }
}